

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O0

bool __thiscall
aeron::archive::ArchiveProxy::getRecordingPosition
          (ArchiveProxy *this,int64_t recordingId,int64_t correlationId,int64_t controlSessionId)

{
  bool bVar1;
  RecordingPositionRequest *pRVar2;
  uint64_t uVar3;
  undefined1 local_60 [8];
  RecordingPositionRequest msg;
  int64_t controlSessionId_local;
  int64_t correlationId_local;
  int64_t recordingId_local;
  ArchiveProxy *this_local;
  
  msg.m_actingVersion = controlSessionId;
  io::aeron::archive::codecs::RecordingPositionRequest::RecordingPositionRequest
            ((RecordingPositionRequest *)local_60);
  pRVar2 = wrapAndApplyHeader<io::aeron::archive::codecs::RecordingPositionRequest>
                     (this,(RecordingPositionRequest *)local_60);
  pRVar2 = io::aeron::archive::codecs::RecordingPositionRequest::controlSessionId
                     (pRVar2,msg.m_actingVersion);
  pRVar2 = io::aeron::archive::codecs::RecordingPositionRequest::correlationId(pRVar2,correlationId)
  ;
  io::aeron::archive::codecs::RecordingPositionRequest::recordingId(pRVar2,recordingId);
  uVar3 = io::aeron::archive::codecs::RecordingPositionRequest::encodedLength
                    ((RecordingPositionRequest *)local_60);
  bVar1 = offer(this,(int32_t)uVar3);
  return bVar1;
}

Assistant:

bool ArchiveProxy::getRecordingPosition(std::int64_t recordingId, std::int64_t correlationId,
                                        std::int64_t controlSessionId) {
    codecs::RecordingPositionRequest msg;

    wrapAndApplyHeader(msg).controlSessionId(controlSessionId).correlationId(correlationId).recordingId(recordingId);

    return offer(msg.encodedLength());
}